

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

llm_graph_result_ptr __thiscall
llama_context::build_kv_self_defrag(llama_context *this,ggml_context *ctx0,ggml_cgraph *gf)

{
  uint uVar1;
  ggml_type gVar2;
  long lVar3;
  value_type pgVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  pointer plVar7;
  anon_struct_24_1_ba1d5218_for_defrag_info *this_00;
  size_type sVar8;
  const_reference pvVar9;
  ulong uVar10;
  ulong uVar11;
  reference ppgVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  __uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true> in_RDI;
  bool bVar17;
  ggml_tensor *view_v_dst;
  ggml_tensor *view_v_src;
  ggml_tensor *view_k_dst;
  ggml_tensor *view_k_src;
  int64_t n_embd_v_gqa;
  int64_t n_embd_k_gqa;
  uint32_t il;
  uint32_t nm;
  uint32_t id;
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ids;
  llama_hparams *hparams;
  __single_object res;
  unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *in_stack_fffffffffffffd88;
  llama_hparams *in_stack_fffffffffffffd90;
  unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *in_stack_fffffffffffffd98;
  unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
  *in_stack_fffffffffffffda0;
  undefined8 local_88;
  undefined8 local_80;
  uint local_48;
  int local_44;
  uint local_3c;
  
  std::make_unique<llm_graph_result>();
  lVar3 = *in_RSI;
  plVar7 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
           operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                       *)0x3da14a);
  this_00 = &plVar7->defrag_info;
  for (local_3c = 0;
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_00->ids),
      local_3c < sVar8; local_3c = local_3c + 1) {
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this_00->ids,(ulong)local_3c);
    uVar1 = *pvVar9;
    if ((local_3c != uVar1) &&
       (sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_00->ids),
       uVar1 != sVar8)) {
      local_44 = 1;
      while( true ) {
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_00->ids);
        bVar17 = false;
        if (local_3c + local_44 < sVar8) {
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this_00->ids,(ulong)(local_3c + local_44));
          bVar17 = *pvVar9 == uVar1 + local_44;
        }
        if (!bVar17) break;
        local_44 = local_44 + 1;
      }
      for (local_48 = 0; uVar6 = (uint32_t)((ulong)in_stack_fffffffffffffd88 >> 0x20),
          local_48 < *(uint *)(lVar3 + 0x38); local_48 = local_48 + 1) {
        uVar5 = llama_hparams::n_embd_k_gqa(in_stack_fffffffffffffd90,uVar6);
        uVar10 = (ulong)uVar5;
        uVar6 = llama_hparams::n_embd_v_gqa(in_stack_fffffffffffffd90,uVar6);
        uVar11 = (ulong)uVar6;
        plVar7 = std::
                 unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
                 operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                             *)0x3da343);
        ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                             (&plVar7->k_l,(ulong)local_48);
        pgVar4 = *ppgVar12;
        plVar7 = std::
                 unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
                 operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                             *)0x3da392);
        ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                             (&plVar7->k_l,(ulong)local_48);
        uVar13 = ggml_row_size((*ppgVar12)->type,uVar10);
        plVar7 = std::
                 unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
                 operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                             *)0x3da3da);
        ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                             (&plVar7->k_l,(ulong)local_48);
        uVar14 = ggml_row_size((*ppgVar12)->type,uVar10 * local_3c);
        uVar13 = ggml_view_2d(in_RDX,pgVar4,uVar10,local_44,uVar13,uVar14);
        plVar7 = std::
                 unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
                 operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                             *)0x3da494);
        ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                             (&plVar7->k_l,(ulong)local_48);
        pgVar4 = *ppgVar12;
        plVar7 = std::
                 unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
                 operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                             *)0x3da4e3);
        ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                             (&plVar7->k_l,(ulong)local_48);
        uVar14 = ggml_row_size((*ppgVar12)->type,uVar10);
        plVar7 = std::
                 unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
                 operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                             *)0x3da52b);
        ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                             (&plVar7->k_l,(ulong)local_48);
        uVar15 = ggml_row_size((*ppgVar12)->type,uVar10 * uVar1);
        uVar14 = ggml_view_2d(in_RDX,pgVar4,uVar10,local_44,uVar14,uVar15);
        if ((*(byte *)((long)in_RSI + 0x43) & 1) == 0) {
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da8c1);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          pgVar4 = *ppgVar12;
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da910);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          gVar2 = (*ppgVar12)->type;
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da941);
          uVar15 = ggml_row_size(gVar2,plVar7->size);
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da970);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          uVar16 = ggml_row_size((*ppgVar12)->type,local_3c);
          local_80 = ggml_view_2d(in_RDX,pgVar4,local_44,uVar11,uVar15,uVar16);
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3daa0b);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          pgVar4 = *ppgVar12;
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3daa4e);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          gVar2 = (*ppgVar12)->type;
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3daa79);
          uVar15 = ggml_row_size(gVar2,plVar7->size);
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3daaa2);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          uVar16 = ggml_row_size((*ppgVar12)->type,uVar1);
          local_88 = ggml_view_2d(in_RDX,pgVar4,local_44,uVar11,uVar15,uVar16);
        }
        else {
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da5f7);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          pgVar4 = *ppgVar12;
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da646);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          uVar15 = ggml_row_size((*ppgVar12)->type,uVar11);
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da68e);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          uVar16 = ggml_row_size((*ppgVar12)->type,uVar11 * local_3c);
          local_80 = ggml_view_2d(in_RDX,pgVar4,uVar11,local_44,uVar15,uVar16);
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da748);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          pgVar4 = *ppgVar12;
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da797);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          uVar15 = ggml_row_size((*ppgVar12)->type,uVar11);
          plVar7 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3da7df);
          ppgVar12 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                               (&plVar7->v_l,(ulong)local_48);
          uVar16 = ggml_row_size((*ppgVar12)->type,uVar11 * uVar1);
          local_88 = ggml_view_2d(in_RDX,pgVar4,uVar11,local_44,uVar15,uVar16);
        }
        in_stack_fffffffffffffd98 = in_RCX;
        in_stack_fffffffffffffda0 =
             (unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
             ggml_cpy(in_RDX,uVar13,uVar14);
        ggml_build_forward_expand(in_stack_fffffffffffffd98,in_stack_fffffffffffffda0);
        in_stack_fffffffffffffd88 = in_RCX;
        in_stack_fffffffffffffd90 = (llama_hparams *)ggml_cpy(in_RDX,local_80,local_88);
        ggml_build_forward_expand(in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
      }
      local_3c = local_44 + -1 + local_3c;
    }
  }
  std::unique_ptr<llm_graph_result_i,std::default_delete<llm_graph_result_i>>::
  unique_ptr<llm_graph_result,std::default_delete<llm_graph_result>,void>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::~unique_ptr
            ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
             in_stack_fffffffffffffd90);
  return (__uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true>)
         (tuple<llm_graph_result_i_*,_std::default_delete<llm_graph_result_i>_>)
         in_RDI.super___uniq_ptr_impl<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>.
         _M_t.super__Tuple_impl<0UL,_llm_graph_result_i_*,_std::default_delete<llm_graph_result_i>_>
         .super__Head_base<0UL,_llm_graph_result_i_*,_false>._M_head_impl;
}

Assistant:

llm_graph_result_ptr llama_context::build_kv_self_defrag(
        ggml_context * ctx0,
        ggml_cgraph * gf) const {
    auto res = std::make_unique<llm_graph_result>();

    const auto & hparams = model.hparams;

    const auto & ids = kv_self->defrag_info.ids;

#if 0
    // CPU defrag
    //
    // TODO: optimizations are possible:
    //       - multiple threads
    //       - avoid copying to the host memory when already there
    //
    // likely not worth the effort, as we have ggml_graph based defrag
    //

    const uint32_t n_embd_k_gqa = hparams.n_embd_k_gqa();
    const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa();

    const uint32_t kv_size = size;

    std::vector<uint8_t> buf_k;
    std::vector<uint8_t> buf_v;

    for (uint32_t il = 0; il < n_layer; ++il) {
        const size_t k_size_row = ggml_row_size(k_l[il]->type, n_embd_k_gqa);
        const size_t k_size     = ggml_row_size(k_l[il]->type, n_embd_k_gqa*kv_size);

        const size_t v_size_el = ggml_type_size(v_l[il]->type);
        const size_t v_size    = ggml_row_size (v_l[il]->type, n_embd_v_gqa*kv_size);

        buf_k.resize(k_size);
        buf_v.resize(v_size);

        ggml_backend_tensor_get(k_l[il], buf_k.data(), 0, buf_k.size());
        ggml_backend_tensor_get(v_l[il], buf_v.data(), 0, buf_v.size());

        // batch move [i, i+nm) to [id, id+nm)
        // note: cells can move only to a lower index
        for (uint32_t i = 0; i < n_kv; ++i) {
            const uint32_t id = ids[i];

            if (i == id || id == n_kv) {
                continue;
            }

            uint32_t nm = 1;

            while (i + nm < n_kv && ids[i + nm] == id + nm) {
                nm++;
            }

            // move keys
            {
                const int64_t os =  i*k_size_row;
                const int64_t od = id*k_size_row;

                memcpy(buf_k.data() + od, buf_k.data() + os, nm*k_size_row);
            }

            // move values (note: they are transposed)
            {
                const int64_t os =  i;
                const int64_t od = id;

                for (uint32_t j = 0; j < n_embd_v_gqa; ++j) {
                    memcpy(buf_v.data() + (od + j*kv_size)*v_size_el, buf_v.data() + (os + j*kv_size)*v_size_el, nm*v_size_el);
                }
            }

            i += nm - 1;
        }

        ggml_backend_tensor_set(k_l[il], buf_k.data(), 0, buf_k.size());
        ggml_backend_tensor_set(v_l[il], buf_v.data(), 0, buf_v.size());
    }
#else
    for (uint32_t i = 0; i < ids.size(); ++i) {
        const uint32_t id = ids[i];

        if (i == id || id == ids.size()) {
            continue;
        }

        uint32_t nm = 1;

        while (i + nm < ids.size() && ids[i + nm] == id + nm) {
            nm++;
        }

        for (uint32_t il = 0; il < hparams.n_layer; ++il) { // NOLINT
            const int64_t n_embd_k_gqa = hparams.n_embd_k_gqa(il);
            const int64_t n_embd_v_gqa = hparams.n_embd_v_gqa(il);

            ggml_tensor * view_k_src = ggml_view_2d(ctx0, kv_self->k_l[il],
                    n_embd_k_gqa, nm,
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa),
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa*i));

            ggml_tensor * view_k_dst = ggml_view_2d(ctx0, kv_self->k_l[il],
                    n_embd_k_gqa, nm,
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa),
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa*id));

            ggml_tensor * view_v_src;
            ggml_tensor * view_v_dst;

            if (cparams.flash_attn) {
                // NOTE: the V cache is not transposed when using flash attention
                view_v_src = ggml_view_2d(ctx0, kv_self->v_l[il],
                        n_embd_v_gqa, nm,
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa),
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa*i));

                view_v_dst = ggml_view_2d(ctx0, kv_self->v_l[il],
                        n_embd_v_gqa, nm,
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa),
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa*id));
            } else {
                view_v_src = ggml_view_2d(ctx0, kv_self->v_l[il],
                        nm, n_embd_v_gqa,
                        ggml_row_size(kv_self->v_l[il]->type, kv_self->size),
                        ggml_row_size(kv_self->v_l[il]->type, i));

                view_v_dst = ggml_view_2d(ctx0, kv_self->v_l[il],
                        nm, n_embd_v_gqa,
                        ggml_row_size(kv_self->v_l[il]->type, kv_self->size),
                        ggml_row_size(kv_self->v_l[il]->type, id));
            }

            ggml_build_forward_expand(gf, ggml_cpy(ctx0, view_k_src, view_k_dst));
            ggml_build_forward_expand(gf, ggml_cpy(ctx0, view_v_src, view_v_dst));
        }

        i += nm - 1;
    }

    //LLAMA_LOG_INFO("gf->n_nodes = %d\n", gf->n_nodes);
#endif

    return res;
}